

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O0

void __thiscall HashSet<String>::~HashSet(HashSet<String> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *next;
  ItemBlock *i_1;
  Item *end;
  Item *i;
  HashSet<String> *this_local;
  
  if (this->data != (Item **)0x0) {
    operator_delete__(this->data);
  }
  for (end = (this->_begin).item; end != &this->endItem; end = end->next) {
    Item::~Item(end);
  }
  pIVar1 = this->blocks;
  while (next = pIVar1, next != (ItemBlock *)0x0) {
    pIVar1 = next->next;
    if (next != (ItemBlock *)0x0) {
      operator_delete__(next);
    }
  }
  Item::~Item(&this->endItem);
  return;
}

Assistant:

~HashSet()
  {
    delete[] (char*)data;
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }